

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

void crnlib::image_utils::convert_image(image_u8 *img,conversion_type conv_type)

{
  color_quad<unsigned_char,_int> *pcVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int b;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint y;
  uint uVar10;
  uint x;
  uint uVar11;
  byte bVar12;
  
  switch(conv_type) {
  case cConversion_To_CCxY:
    img->m_comp_flags = 0x4b;
    break;
  case cConversion_From_CCxY:
    img->m_comp_flags = 7;
    break;
  case cConversion_To_xGxR:
    img->m_comp_flags = 0x2a;
    break;
  case cConversion_From_xGxR:
  case cConversion_From_xGBR:
  case cConversion_XY_to_XYZ:
    img->m_comp_flags = 0x27;
    break;
  case cConversion_To_xGBR:
    img->m_comp_flags = 0x2e;
    break;
  case cConversion_To_AGBR:
  case cConversion_From_AGBR:
    img->m_comp_flags = 0x2f;
    break;
  case cConversion_Y_To_A:
    *(byte *)&img->m_comp_flags = (byte)img->m_comp_flags | 8;
    break;
  case cConversion_A_To_RGBA:
    img->m_comp_flags = 0xf;
    break;
  case cConversion_Y_To_RGB:
    img->m_comp_flags = img->m_comp_flags & 8 | 0x17;
    break;
  case cConversion_To_Y:
    *(byte *)&img->m_comp_flags = (byte)img->m_comp_flags | 0x10;
    break;
  default:
    goto switchD_0011b217_default;
  }
  if (img->m_height != 0) {
    uVar9 = 0;
    do {
      if (img->m_width != 0) {
        uVar11 = 0;
        do {
          pcVar1 = img->m_pPixels;
          uVar6 = img->m_pitch * uVar9 + uVar11;
          bVar2 = pcVar1[uVar6].field_0.field_0.r;
          bVar8 = pcVar1[uVar6].field_0.field_0.g;
          bVar3 = pcVar1[uVar6].field_0.field_0.b;
          uVar10 = (uint)bVar3;
          bVar4 = pcVar1[uVar6].field_0.field_0.a;
          bVar12 = bVar2;
          if (0xc < (uint)conv_type) goto LAB_0011b4e2;
          uVar7 = (uint)bVar3;
          x = (uint)bVar2;
          y = (uint)bVar8;
          uVar6 = (uint)bVar4;
          switch(conv_type) {
          case cConversion_To_CCxY:
            iVar5 = (int)(uVar7 * 0x8000 + 0x8000 + y * -0x54cd + (uint)bVar2 * -0x2b33) >> 0x10;
            uVar10 = iVar5 + 0x7b;
            if (uVar10 < 0x100) {
LAB_0011b3e5:
              bVar12 = (byte)uVar10;
            }
            else {
              bVar12 = 0;
              if (-0x7c < iVar5) {
                if (0xfe < (int)uVar10) {
                  uVar10 = 0xff;
                }
                goto LAB_0011b3e5;
              }
            }
            iVar5 = (int)(y * -0x6b2f + (uint)bVar2 * 0x8000 + (uint)bVar3 * -0x14d1 + 0x8000) >>
                    0x10;
            uVar10 = iVar5 + 0x7d;
            if (uVar10 < 0x100) {
LAB_0011b421:
              bVar8 = (byte)uVar10;
            }
            else {
              bVar8 = 0;
              if (-0x7e < iVar5) {
                if (0xfe < (int)uVar10) {
                  uVar10 = 0xff;
                }
                goto LAB_0011b421;
              }
            }
            bVar4 = (byte)((uint)bVar3 * 0x1d2f + 0x8000 + y * 0x9646 + (uint)bVar2 * 0x4c8b >> 0x10
                          );
            bVar3 = 0;
            break;
          case cConversion_From_CCxY:
            uVar10 = ((int)(y * 0x166e9 + -0xaebfc5) >> 0x10) + uVar6;
            if (0xff < uVar10) {
              if ((int)uVar10 < 0) {
                uVar10 = 0;
              }
              else if (0xfe < (int)uVar10) {
                uVar10 = 0xff;
              }
            }
            bVar4 = (byte)uVar10;
            uVar10 = ((int)((x - 0x7b) * -0x581a + (y - 0x7d) * -0xb6d2 + 0x8000) >> 0x10) + uVar6;
            if (0xff < uVar10) {
              if ((int)uVar10 < 0) {
                uVar10 = 0;
              }
              else if (0xfe < (int)uVar10) {
                uVar10 = 0xff;
              }
            }
            bVar8 = (byte)uVar10;
            uVar10 = ((int)((x - 0x7b) * 0x1c5a2 + 0x8000) >> 0x10) + uVar6;
            if (0xff < uVar10) {
              if ((int)uVar10 < 0) {
                uVar10 = 0;
              }
              else if (0xfe < (int)uVar10) {
                uVar10 = 0xff;
              }
            }
          case cConversion_From_xGBR:
switchD_0011b2e4_caseD_5:
            bVar3 = (byte)uVar10;
            bVar12 = bVar4;
            bVar4 = 0xff;
            break;
          case cConversion_To_xGxR:
            bVar3 = 0;
            bVar12 = 0;
            bVar4 = bVar2;
            break;
          case cConversion_From_xGxR:
            bVar2 = regen_z((uint)bVar4,y);
            uVar10 = (uint)bVar2;
            goto switchD_0011b2e4_caseD_5;
          case cConversion_To_xGBR:
            bVar4 = 0;
          default:
            bVar12 = bVar4;
            bVar4 = bVar2;
            break;
          case cConversion_XY_to_XYZ:
            bVar3 = regen_z(x,y);
            bVar4 = 0xff;
            break;
          case cConversion_Y_To_A:
            bVar4 = (byte)(uVar7 * 0x1d2f + y * 0x9646 + x * 0x4c8b + 0x8000 >> 0x10);
            break;
          case cConversion_A_To_RGBA:
            bVar12 = bVar4;
            bVar3 = bVar4;
            bVar8 = bVar4;
            break;
          case cConversion_Y_To_RGB:
          case cConversion_To_Y:
            bVar12 = (byte)(uVar7 * 0x1d2f + y * 0x9646 + x * 0x4c8b + 0x8000 >> 0x10);
            bVar3 = bVar12;
            bVar8 = bVar12;
          }
LAB_0011b4e2:
          pcVar1 = img->m_pPixels;
          uVar10 = img->m_pitch * uVar9 + uVar11;
          pcVar1[uVar10].field_0.field_0.r = bVar12;
          pcVar1[uVar10].field_0.field_0.g = bVar8;
          pcVar1[uVar10].field_0.field_0.b = bVar3;
          pcVar1[uVar10].field_0.field_0.a = bVar4;
          uVar11 = uVar11 + 1;
        } while (uVar11 < img->m_width);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < img->m_height);
  }
switchD_0011b217_default:
  return;
}

Assistant:

void convert_image(image_u8& img, image_utils::conversion_type conv_type)
        {
            switch (conv_type)
            {
            case image_utils::cConversion_To_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagLumaChroma));
                break;
            }
            case image_utils::cConversion_From_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid));
                break;
            }
            case image_utils::cConversion_To_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_XY_to_XYZ:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case cConversion_Y_To_A:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_A_To_RGBA:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_Y_To_RGB:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagGrayscale | (img.has_alpha() ? pixel_format_helpers::cCompFlagAValid : 0)));
                break;
            }
            case cConversion_To_Y:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagGrayscale));
                break;
            }
            default:
            {
                CRNLIB_ASSERT(false);
                return;
            }
            }

            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    color_quad_u8 src(img(x, y));
                    color_quad_u8 dst;

                    switch (conv_type)
                    {
                    case image_utils::cConversion_To_CCxY:
                    {
                        color::RGB_to_YCC(dst, src);
                        break;
                    }
                    case image_utils::cConversion_From_CCxY:
                    {
                        color::YCC_to_RGB(dst, src);
                        break;
                    }
                    case image_utils::cConversion_To_xGxR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = 0;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGxR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.a, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_To_xGBR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_To_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_From_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_XY_to_XYZ:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.r, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_Y_To_A:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = static_cast<uint8>(src.get_luma());
                        break;
                    }
                    case image_utils::cConversion_Y_To_RGB:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_A_To_RGBA:
                    {
                        dst.r = src.a;
                        dst.g = src.a;
                        dst.b = src.a;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_To_Y:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    default:
                    {
                        CRNLIB_ASSERT(false);
                        dst = src;
                        break;
                    }
                    }

                    img(x, y) = dst;
                }
            }
        }